

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_debugger.cpp
# Opt level: O0

void __thiscall Debugger::Stop(Debugger *this)

{
  undefined1 local_38 [8];
  unique_lock<std::mutex> luaThreadLock;
  lock_guard<std::mutex> local_18;
  lock_guard<std::mutex> lock;
  Debugger *this_local;
  
  this->running = false;
  this->skipHook = true;
  this->blocking = false;
  lock._M_device = (mutex_type *)this;
  std::lock_guard<std::mutex>::lock_guard(&local_18,&this->hookStateMtx);
  std::shared_ptr<HookState>::shared_ptr
            ((shared_ptr<HookState> *)&luaThreadLock._M_owns,(nullptr_t)0x0);
  std::shared_ptr<HookState>::operator=
            (&this->hookState,(shared_ptr<HookState> *)&luaThreadLock._M_owns);
  std::shared_ptr<HookState>::~shared_ptr((shared_ptr<HookState> *)&luaThreadLock._M_owns);
  std::lock_guard<std::mutex>::~lock_guard(&local_18);
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_38,&this->luaThreadMtx)
  ;
  std::
  vector<std::function<void_(lua_State_*)>,_std::allocator<std::function<void_(lua_State_*)>_>_>::
  clear(&this->luaThreadExecutors);
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_38);
  ExitDebugMode(this);
  return;
}

Assistant:

void Debugger::Stop() {
	running = false;
	skipHook = true;
	blocking = false;

	// 停止main_state 的hook
	// 但不停止coroutine的hook因为没有办法知道这个lua state 指针是否有效
	// stop在交互线程，不应该设置hook
	// 而且清理对lua_state 的 hook没有必要
	// UpdateHook(0, mainL);

	// 清理hook 状态
	{
		std::lock_guard<std::mutex> lock(hookStateMtx);
		hookState = nullptr;
	}

	{
		// clear lua thread executors
		std::unique_lock<std::mutex> luaThreadLock(luaThreadMtx);
		luaThreadExecutors.clear();
	}
	ExitDebugMode();
}